

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall drawPPTX::push_back(drawPPTX *this,baseObject *obj)

{
  pointer pbVar1;
  pointer pbVar2;
  double dVar3;
  baseObject *it;
  pointer pbVar4;
  vector<baseObject,_std::allocator<baseObject>_> *__range2;
  
  std::vector<baseObject,_std::allocator<baseObject>_>::push_back(&this->objects,obj);
  if (obj->type == OBJECT_CURVES) {
    dVar3 = (obj->rangeX).max;
    (this->rangeX).min = (obj->rangeX).min;
    (this->rangeX).max = dVar3;
    dVar3 = (obj->rangeY).max;
    (this->rangeY).min = (obj->rangeY).min;
    (this->rangeY).max = dVar3;
  }
  else {
    pbVar4 = (this->objects).super__Vector_base<baseObject,_std::allocator<baseObject>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar1 = (this->objects).super__Vector_base<baseObject,_std::allocator<baseObject>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pbVar4 != pbVar1) {
      do {
        if (pbVar4->type == OBJECT_CURVES) {
          pbVar2 = (this->objects).super__Vector_base<baseObject,_std::allocator<baseObject>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          dVar3 = (this->rangeX).max;
          pbVar2[-1].rangeX.min = (this->rangeX).min;
          pbVar2[-1].rangeX.max = dVar3;
          pbVar2 = (this->objects).super__Vector_base<baseObject,_std::allocator<baseObject>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          dVar3 = (this->rangeY).max;
          pbVar2[-1].rangeY.min = (this->rangeY).min;
          pbVar2[-1].rangeY.max = dVar3;
        }
        pbVar4 = pbVar4 + 1;
      } while (pbVar4 != pbVar1);
    }
  }
  return;
}

Assistant:

void push_back(const baseObject& obj)
    {
        objects.push_back(obj);
        if (obj.getType() == OBJECT_CURVES)
        {
            rangeX = obj.getRangeX();
            rangeY = obj.getRangeY();
        }
        else
        {
            for (auto&& it : objects)
            {
                if (it.getType() == OBJECT_CURVES)
                {
                    objects[objects.size() - 1].setRangeX(rangeX);
                    objects[objects.size() - 1].setRangeY(rangeY);
                }
            }
        }
    }